

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_phrase.c
# Opt level: O2

void njd_set_accent_phrase(NJD *njd)

{
  int iVar1;
  char *pcVar2;
  NJDNode *node;
  char *pcVar3;
  NJDNode *node_00;
  
  if ((njd != (NJD *)0x0) && (node = njd->head, node != (NJDNode *)0x0)) {
    while (node = node->next, node != (NJDNode *)0x0) {
      iVar1 = NJDNode_get_chain_flag(node);
      if (iVar1 < 0) {
        NJDNode_set_chain_flag(node,1);
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,1);
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edeab);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edec1);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
            if (iVar1 == 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_eeff2 + 3);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edeab);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
            if (iVar1 != 0) goto LAB_001723af;
          }
          NJDNode_set_chain_flag(node,0);
        }
LAB_001723af:
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edee1);
        if (iVar1 == 0) {
LAB_00172458:
          NJDNode_set_chain_flag(node,0);
        }
        else {
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edee1);
          if (iVar1 == 0) goto LAB_00172458;
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edeeb);
          if (iVar1 == 0) goto LAB_00172458;
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edeeb);
          if (iVar1 == 0) goto LAB_00172458;
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edef5);
          if (iVar1 == 0) goto LAB_00172458;
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_edef5);
          if (iVar1 == 0) goto LAB_00172458;
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_eac16);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_eac16);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f04fb + 6);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f0022 + 10);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f04fb + 6);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f04fb + 6);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_f0022 + 10);
            if (iVar1 != 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f0022 + 10);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f04fb + 6);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_f0022 + 10);
            if (iVar1 != 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos_group1(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edf29);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edeab);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f0252 + 7);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(node->prev);
            pcVar3 = anon_var_dwarf_eeff2 + 3;
            iVar1 = strcmp(pcVar2,anon_var_dwarf_eeff2 + 3);
            node_00 = node->prev;
            if (iVar1 == 0) {
LAB_00172911:
              pcVar2 = NJDNode_get_cform(node_00);
              iVar1 = strtopcmp(pcVar2,pcVar3);
              if (iVar1 == -1) goto LAB_001725cb;
            }
            else {
              pcVar2 = NJDNode_get_pos(node_00);
              pcVar3 = anon_var_dwarf_edeab;
              iVar1 = strcmp(pcVar2,anon_var_dwarf_edeab);
              node_00 = node->prev;
              if (iVar1 == 0) goto LAB_00172911;
              pcVar2 = NJDNode_get_pos(node_00);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_f0022 + 10);
              if (iVar1 != 0) goto LAB_001725cb;
              pcVar2 = NJDNode_get_pos_group1(node->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_f0036 + 7);
              if (iVar1 != 0) goto LAB_001725cb;
              pcVar2 = NJDNode_get_string(node->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_eb927 + 6);
              if (iVar1 != 0) {
                pcVar2 = NJDNode_get_string(node->prev);
                iVar1 = strcmp(pcVar2,anon_var_dwarf_e9d80);
                if (iVar1 != 0) goto LAB_001725cb;
              }
            }
            NJDNode_set_chain_flag(node,1);
          }
        }
LAB_001725cb:
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_eeff2 + 3);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f0252 + 7);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(node->prev);
            pcVar3 = anon_var_dwarf_eeff2 + 3;
            iVar1 = strcmp(pcVar2,anon_var_dwarf_eeff2 + 3);
            if (iVar1 == 0) {
              pcVar2 = NJDNode_get_cform(node->prev);
              iVar1 = strtopcmp(pcVar2,pcVar3);
              if (iVar1 != -1) {
LAB_0017294d:
                NJDNode_set_chain_flag(node,1);
              }
            }
            else {
              pcVar2 = NJDNode_get_pos(node->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
              if (iVar1 == 0) {
                pcVar2 = NJDNode_get_pos_group1(node->prev);
                iVar1 = strcmp(pcVar2,anon_var_dwarf_f014a + 7);
                if (iVar1 == 0) goto LAB_0017294d;
              }
            }
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_eeff2 + 3);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(node);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_edeab);
            if (iVar1 != 0) {
              pcVar2 = NJDNode_get_pos_group1(node);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_edec1);
              if (iVar1 != 0) goto LAB_0017266c;
            }
          }
          NJDNode_set_chain_flag(node,0);
        }
LAB_0017266c:
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_e92dd);
        if (iVar1 == 0) {
LAB_001726a3:
          NJDNode_set_chain_flag(node,0);
        }
        else {
          pcVar2 = NJDNode_get_pos(node->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_e92dd);
          if (iVar1 == 0) goto LAB_001726a3;
        }
        pcVar2 = NJDNode_get_pos(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edf85);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,0);
        }
        pcVar2 = NJDNode_get_pos_group3(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edf8f);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos(node->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_f019c + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group3(node);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_f01a6 + 3);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar2 = NJDNode_get_pos_group1(node);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_edf29);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
      }
    }
  }
  return;
}

Assistant:

void njd_set_accent_phrase(NJD * njd)
{
   NJDNode *node;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (NJDNode_get_chain_flag(node) < 0) {
         /* Rule 01 */
         NJDNode_set_chain_flag(node, 1);

         /* Rule 02 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 1);

         /* Rule 03 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 04 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp
                (NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
                  NJDNode_set_chain_flag(node, 0);

         /* Rule 05 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
               NJDNode_set_chain_flag(node, 0);
            else if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 06 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 07 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU)
                == 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 08 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            NJDNode_set_chain_flag(node, 1);

         /* Rule 09 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 10 */
         if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 11 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI)
                          == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SETSUZOKUJOSHI) == 0) {
                     if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_TE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                     else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_DE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                  }
               }
            }

         /* Rule 12 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SAHEN_SETSUZOKU) == 0)
                     NJDNode_set_chain_flag(node, 1);
               }
            }

         /* Rule 13 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0 ||
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0 ||
                strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 14 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KIGOU) == 0 ||
             strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KIGOU) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 15 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETTOUSHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 16 */
         if (strcmp(NJDNode_get_pos_group3(node->prev), NJD_SET_ACCENT_PHRASE_SEI) == 0
             && strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 17 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0
             && strcmp(NJDNode_get_pos_group3(node), NJD_SET_ACCENT_PHRASE_MEI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 18 */
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            NJDNode_set_chain_flag(node, 1);
      }
   }
}